

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any __thiscall cs_impl::any::make_protect<cs::callable,cs::function&>(any *this,function *args)

{
  proxy *ppVar1;
  int local_28;
  int local_24;
  holder<cs::callable> *local_20;
  
  local_28 = 1;
  local_24 = local_28;
  local_20 = cs::
             allocator_type<cs_impl::any::holder<cs::callable>,64ul,cs_impl::default_allocator_provider>
             ::alloc<cs::function&>
                       ((allocator_type<cs_impl::any::holder<cs::callable>,64ul,cs_impl::default_allocator_provider>
                         *)holder<cs::callable>::allocator,args);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,int,cs_impl::any::holder<cs::callable>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,&local_24,&local_28,&local_20);
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}